

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O0

void __thiscall xmrig::JobResultsPrivate::submit(JobResultsPrivate *this,JobResult *result)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  value_type *in_stack_ffffffffffffffd8;
  list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::push_back
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uv_async_send(in_RDI[10]._M_device);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x233035);
  return;
}

Assistant:

inline void submit(const JobResult &result)
    {
        std::lock_guard<std::mutex> lock(m_mutex);
        m_results.push_back(result);

        uv_async_send(m_async);
    }